

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PackedStructType *type,string_view overrideName)

{
  string_view str;
  string_view str_00;
  bool bVar1;
  Scope *pSVar2;
  pointer pFVar3;
  size_t sVar4;
  basic_string_view<char> local_b0;
  string_view local_90;
  string_view local_80;
  TypePrinter *local_70;
  size_t local_68;
  string_view local_60;
  PackedStructType *local_50;
  PackedStructType *type_local;
  TypePrinter *this_local;
  string_view overrideName_local;
  
  overrideName_local._M_len = (size_t)overrideName._M_str;
  this_local = (TypePrinter *)overrideName._M_len;
  local_50 = type;
  type_local = (PackedStructType *)this;
  if ((this->options).anonymousTypeStyle == FriendlyName) {
    pSVar2 = Symbol::getParentScope((Symbol *)type);
    printScope(this,pSVar2);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (bVar1) {
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_60,"<unnamed packed struct>");
      FormatBuffer::append(pFVar3,local_60);
    }
    else {
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      local_70 = this_local;
      local_68 = overrideName_local._M_len;
      str_00._M_str = (char *)overrideName_local._M_len;
      str_00._M_len = (size_t)this_local;
      FormatBuffer::append(pFVar3,str_00);
    }
  }
  else {
    pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->(&this->buffer);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_80,"struct packed");
    FormatBuffer::append(pFVar3,local_80);
    if (((local_50->super_IntegralType).isSigned & 1U) != 0) {
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90," signed");
      FormatBuffer::append(pFVar3,local_90);
    }
    appendMembers(this,&local_50->super_Scope);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (bVar1) {
      pSVar2 = Symbol::getParentScope((Symbol *)local_50);
      printScope(this,pSVar2);
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      overrideName_local._M_str = "s${}";
      sVar4 = std::char_traits<char>::length("s${}");
      local_b0.size_ = sVar4;
      FormatBuffer::format<int_const&>
                (pFVar3,(format_string<const_int_&>)local_b0,&local_50->systemId);
    }
    else {
      pFVar3 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->(&this->buffer);
      str._M_str = (char *)overrideName_local._M_len;
      str._M_len = (size_t)this_local;
      FormatBuffer::append(pFVar3,str);
    }
  }
  return;
}

Assistant:

void TypePrinter::visit(const PackedStructType& type, string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (overrideName.empty())
            buffer->append("<unnamed packed struct>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("struct packed");
        if (type.isSigned)
            buffer->append(" signed");

        appendMembers(type);

        if (!overrideName.empty())
            buffer->append(overrideName);
        else {
            printScope(type.getParentScope());
            buffer->format("s${}", type.systemId);
        }
    }
}